

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void load_vector_vector<QPDF::HPageOffsetEntry>
               (BitStream *bit_stream,int nitems1,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec1,
               offset_in_HPageOffsetEntry_to_int nitems2,int bits_wanted,
               offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> vec2)

{
  unsigned_long uVar1;
  reference pvVar2;
  size_t i1;
  ulong __n;
  undefined4 in_register_00000084;
  int i2;
  int iVar3;
  int local_3c;
  int local_38;
  int local_34;
  
  local_38 = (int)nitems2;
  __n = 0;
  local_34 = nitems1;
  while( true ) {
    uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_34);
    if (uVar1 <= __n) break;
    iVar3 = 0;
    while( true ) {
      pvVar2 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (vec1,__n);
      if (pvVar2->nshared_objects <= iVar3) break;
      pvVar2 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (vec1,__n);
      uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_38);
      local_3c = BitStream::getBitsInt(bit_stream,uVar1);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&pvVar2->delta_nobjects + CONCAT44(in_register_00000084,bits_wanted)),
                 &local_3c);
      iVar3 = iVar3 + 1;
    }
    __n = __n + 1;
  }
  BitStream::skipToNextByte(bit_stream);
  return;
}

Assistant:

static void
load_vector_vector(
    BitStream& bit_stream,
    int nitems1,
    std::vector<T>& vec1,
    int T::* nitems2,
    int bits_wanted,
    std::vector<int> T::* vec2)
{
    // nitems1 times, read nitems2 (from the ith element of vec1) items into the vec2 vector field
    // of the ith item of vec1.
    for (size_t i1 = 0; i1 < QIntC::to_size(nitems1); ++i1) {
        for (int i2 = 0; i2 < vec1.at(i1).*nitems2; ++i2) {
            (vec1.at(i1).*vec2).push_back(bit_stream.getBitsInt(QIntC::to_size(bits_wanted)));
        }
    }
    bit_stream.skipToNextByte();
}